

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetSelectLinker::cmTargetSelectLinker(cmTargetSelectLinker *this,cmTarget *target)

{
  cmMakefile *pcVar1;
  cmGlobalGenerator *pcVar2;
  cmTarget *target_local;
  cmTargetSelectLinker *this_local;
  
  this->Preference = 0;
  this->Target = target;
  cmsys::
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  ::hash_set(&this->Preferred);
  pcVar1 = cmTarget::GetMakefile(this->Target);
  this->Makefile = pcVar1;
  pcVar2 = cmMakefile::GetGlobalGenerator(this->Makefile);
  this->GG = pcVar2;
  return;
}

Assistant:

cmTargetSelectLinker(cmTarget const* target): Preference(0), Target(target)
    {
    this->Makefile = this->Target->GetMakefile();
    this->GG = this->Makefile->GetGlobalGenerator();
    }